

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomOne.cpp
# Opt level: O2

string * __thiscall
WhiteRoomOne::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,WhiteRoomOne *this,bool longform)

{
  itemLocation iVar1;
  ItemWrapper *this_00;
  ulong uVar2;
  itemType local_1c;
  
  local_1c = LADDER;
  this_00 = ItemTable::getValue((this->super_Room).table,&local_1c);
  iVar1 = ItemWrapper::getLocation(this_00);
  uVar2 = 0x48;
  if (iVar1 == HIDDEN) {
    uVar2 = (ulong)!longform << 5 | 8;
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)((long)&(this->super_Room)._vptr_Room + uVar2));
  return __return_storage_ptr__;
}

Assistant:

std::string WhiteRoomOne::getDescription(bool longform) {
    if(table->getValue(LADDER)->getLocation() != HIDDEN){
        return rstate2;
    }
    else if(longform){
        return rstate0;
    }
    else {
        return rstate1;
    }

}